

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O3

string * namingConventions::correctClassName(string *__return_storage_ptr__,string *name)

{
  char cVar1;
  char cVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar3 = (name->_M_dataplus)._M_p;
  uVar7 = 0;
  do {
    uVar8 = (ulong)uVar7;
    iVar5 = (int)pcVar3[uVar8];
    iVar4 = isalpha(iVar5);
    uVar7 = uVar7 + 1;
  } while (iVar4 == 0);
  iVar4 = islower(iVar5);
  if (iVar4 != 0) {
    iVar4 = toupper(iVar5);
    pcVar3[uVar8] = (char)iVar4;
  }
  if (uVar8 < name->_M_string_length) {
    do {
      pcVar3 = (name->_M_dataplus)._M_p;
      cVar1 = pcVar3[uVar8];
      iVar5 = (int)cVar1;
      iVar4 = isupper(iVar5);
      uVar6 = (ulong)uVar7;
      if (iVar4 == 0) {
LAB_00131b37:
        if (((cVar1 != '_') || (pcVar3[uVar6] != '_')) &&
           ((iVar4 = isalpha(iVar5), cVar1 == '_' || ((iVar4 != 0 || (iVar5 - 0x30U < 10))))))
        goto LAB_00131b78;
        std::__cxx11::string::erase((ulong)name,uVar8);
      }
      else {
        cVar2 = pcVar3[uVar6];
        iVar4 = isupper((int)cVar2);
        if (iVar4 == 0) goto LAB_00131b37;
        iVar4 = _tolower((int)cVar2);
        (name->_M_dataplus)._M_p[uVar6] = (char)iVar4;
LAB_00131b78:
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      uVar7 = uVar7 + 1;
      uVar8 = uVar6;
    } while (uVar6 < name->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string namingConventions::correctClassName(std::string name) {
    std::string corrected;
    unsigned int c = 0;
    while (!isalpha(name[c])) {
        c++;
    }
    if (islower(name[c])) {
        name[c] = toupper(name[c]);
    }
    for (; c < name.size(); ++c) {
        if (isupper(name[c]) && isupper(name[c + 1])) {
            name[c + 1] = _tolower(name[c + 1]);
            corrected += name[c];
        } else if (name[c] == '_' && name[c + 1] == '_') {
            name.erase(c, 1);
        } else if (!isalpha(name[c]) && !isdigit(name[c]) &&name[c] != '_') {
            name.erase(c, 1);
        } else {
            corrected += name[c];
        }
    }
    return corrected;

}